

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_SampleSinCos_Test::~Image_SampleSinCos_Test(Image_SampleSinCos_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Image, SampleSinCos) {
    int w = 500, h = 500;
    auto f = [](Point2f p) {
        return std::abs(std::sin(3. * p.x) * Sqr(std::cos(4. * p.y)));
    };
    // Integral of f over [0,1]^2
    Float integral = 1. / 24. * Sqr(std::sin(1.5)) * (8 + std::sin(8.));

    pstd::vector<float> v;
    for (int y = 0; y < h; ++y) {
        Float fy = (y + .5) / h;
        for (int x = 0; x < w; ++x) {
            Float fx = (x + .5) / w;
            v.push_back(f({fx, fy}));
        }
    }

    Image image(v, {w, h}, {"Y"});
    PiecewiseConstant2D distrib(image.GetSamplingDistribution());
    RNG rng;
    for (int i = 0; i < 1000; ++i) {
        Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
        Float pdf;
        Point2f p = distrib.Sample(u, &pdf);
        Float fp = f(p);
        // Allow some error since PiecewiseConstant2D uses a piecewise constant
        // sampling distribution.
        EXPECT_LE(std::abs(fp - pdf * integral), .02f)
            << u << ", fp: " << fp << ", pdf: " << pdf;
    }
}